

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::exceptions::missing_argument::~missing_argument(missing_argument *this)

{
  void *in_RDI;
  
  ~missing_argument((missing_argument *)0x12d488);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

explicit missing_argument(const std::string& option)
  : parsing(
      "Option " + LQUOTE + option + RQUOTE + " is missing an argument"
    )
  {
  }